

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86OR(uchar *stream,x86Reg op1,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  uint uVar2;
  
  if (size - sDWORD < 2) {
    uVar2 = encodeRex(stream,size == sQWORD,op1,index,base);
    puVar1 = stream + uVar2;
    *puVar1 = '\v';
    uVar2 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,(int)regCode[op1]);
    return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
  }
  __assert_fail("size == sDWORD || size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x791,"int x86OR(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
}

Assistant:

int x86OR(unsigned char *stream, x86Reg op1, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, op1, index, base);
	*stream++ = 0x0B;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[op1]);

	return int(stream - start);
}